

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

CURLcode file_connect(connectdata *conn,_Bool *done)

{
  Curl_easy *data;
  undefined8 *puVar1;
  char *__file;
  CURLcode CVar2;
  int iVar3;
  void *pvVar4;
  char *local_40;
  size_t real_path_len;
  
  data = conn->data;
  puVar1 = (undefined8 *)(data->req).protop;
  CVar2 = Curl_urldecode(data,(data->state).up.path,0,&local_40,&real_path_len,false);
  __file = local_40;
  if (CVar2 == CURLE_OK) {
    pvVar4 = memchr(local_40,0,real_path_len);
    if (pvVar4 == (void *)0x0) {
      CVar2 = CURLE_OK;
      iVar3 = open64(__file,0);
      *puVar1 = local_40;
      puVar1[1] = local_40;
      *(int *)(puVar1 + 2) = iVar3;
      if ((iVar3 == -1) && ((data->set).upload == false)) {
        CVar2 = 0x14b000;
        Curl_failf(data,"Couldn\'t open file %s",(data->state).up.path);
        file_done(conn,CVar2,false);
        CVar2 = CURLE_FILE_COULDNT_READ_FILE;
      }
      else {
        *done = true;
      }
    }
    else {
      (*Curl_cfree)(__file);
      CVar2 = CURLE_URL_MALFORMAT;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode file_connect(struct connectdata *conn, bool *done)
{
  struct Curl_easy *data = conn->data;
  char *real_path;
  struct FILEPROTO *file = data->req.protop;
  int fd;
#ifdef DOS_FILESYSTEM
  size_t i;
  char *actual_path;
#endif
  size_t real_path_len;

  CURLcode result = Curl_urldecode(data, data->state.up.path, 0, &real_path,
                                   &real_path_len, FALSE);
  if(result)
    return result;

#ifdef DOS_FILESYSTEM
  /* If the first character is a slash, and there's
     something that looks like a drive at the beginning of
     the path, skip the slash.  If we remove the initial
     slash in all cases, paths without drive letters end up
     relative to the current directory which isn't how
     browsers work.

     Some browsers accept | instead of : as the drive letter
     separator, so we do too.

     On other platforms, we need the slash to indicate an
     absolute pathname.  On Windows, absolute paths start
     with a drive letter.
  */
  actual_path = real_path;
  if((actual_path[0] == '/') &&
      actual_path[1] &&
     (actual_path[2] == ':' || actual_path[2] == '|')) {
    actual_path[2] = ':';
    actual_path++;
    real_path_len--;
  }

  /* change path separators from '/' to '\\' for DOS, Windows and OS/2 */
  for(i = 0; i < real_path_len; ++i)
    if(actual_path[i] == '/')
      actual_path[i] = '\\';
    else if(!actual_path[i]) { /* binary zero */
      Curl_safefree(real_path);
      return CURLE_URL_MALFORMAT;
    }

  fd = open_readonly(actual_path, O_RDONLY|O_BINARY);
  file->path = actual_path;
#else
  if(memchr(real_path, 0, real_path_len)) {
    /* binary zeroes indicate foul play */
    Curl_safefree(real_path);
    return CURLE_URL_MALFORMAT;
  }

  fd = open_readonly(real_path, O_RDONLY);
  file->path = real_path;
#endif
  file->freepath = real_path; /* free this when done */

  file->fd = fd;
  if(!data->set.upload && (fd == -1)) {
    failf(data, "Couldn't open file %s", data->state.up.path);
    file_done(conn, CURLE_FILE_COULDNT_READ_FILE, FALSE);
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  *done = TRUE;

  return CURLE_OK;
}